

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::put_after_get
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uint64_t hash,
          scored_action *val)

{
  hash_elem *phVar1;
  v_hashmap<unsigned_char_*,_Search::scored_action> *this_00;
  v_hashmap<unsigned_char_*,_Search::scored_action> *pvVar2;
  scored_action *in_RDX;
  uint64_t in_RSI;
  uchar **in_RDI;
  v_hashmap<unsigned_char_*,_Search::scored_action> *unaff_retaddr;
  uint64_t in_stack_000001a8;
  uchar **in_stack_000001b0;
  v_hashmap<unsigned_char_*,_Search::scored_action> *in_stack_000001b8;
  uchar **key_00;
  
  key_00 = in_RDI;
  phVar1 = v_array<v_hashmap<unsigned_char_*,_Search::scored_action>::hash_elem>::operator[]
                     ((v_array<v_hashmap<unsigned_char_*,_Search::scored_action>::hash_elem> *)
                      (in_RDI + 3),(size_t)in_RDI[7]);
  if ((phVar1->occupied & 1U) == 0) {
    in_RDI[8] = in_RDI[8] + 1;
    this_00 = (v_hashmap<unsigned_char_*,_Search::scored_action> *)((long)in_RDI[8] << 2);
    pvVar2 = (v_hashmap<unsigned_char_*,_Search::scored_action> *)base_size(this_00);
    if (pvVar2 <= this_00) {
      double_size((v_hashmap<unsigned_char_*,_Search::scored_action> *)hash);
      get(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
    }
  }
  put_after_get_nogrow(unaff_retaddr,key_00,in_RSI,in_RDX);
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }